

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashsearch2.h
# Opt level: O0

bool testSeed<std::__cxx11::string>
               (Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *bin,size_t n2,vector<bool,_std::allocator<bool>_> *final_layer)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  bool bVar2;
  uint32_t uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  reference local_88;
  reference local_78;
  uint local_64;
  const_reference pvStack_60;
  uint32_t h_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key_1;
  size_t j;
  uint local_3c;
  const_reference pvStack_38;
  uint32_t h;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *key;
  size_t i;
  vector<bool,_std::allocator<bool>_> *final_layer_local;
  size_t n2_local;
  Bin<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *bin_local;
  
  i = (size_t)final_layer;
  final_layer_local = (vector<bool,_std::allocator<bool>_> *)n2;
  n2_local = (size_t)bin;
  key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::size(&bin->keys);
  while( true ) {
    key = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          ((long)&key[-1].field_2 + 0xf);
    pbVar1 = key;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::numeric_limits<unsigned_long>::max();
    if (pbVar4 <= pbVar1) {
      return true;
    }
    pvStack_38 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(n2_local + 8),(size_type)key);
    uVar3 = hash2(pvStack_38,(SeedType *)(n2_local + 4));
    local_3c = uVar3 & (uint)final_layer_local;
    _j = std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)i,(ulong)local_3c);
    bVar2 = std::_Bit_reference::operator_cast_to_bool((_Bit_reference *)&j);
    key_1 = key;
    if (bVar2) break;
    local_88 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)i,(ulong)local_3c);
    std::_Bit_reference::operator=(&local_88,true);
  }
  while( true ) {
    key_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&key_1->field_0x1;
    pbVar1 = key_1;
    pbVar4 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(n2_local + 8));
    if (pbVar4 <= pbVar1) break;
    pvStack_60 = std::
                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               *)(n2_local + 8),(size_type)key_1);
    uVar3 = hash2(pvStack_60,(SeedType *)(n2_local + 4));
    local_64 = uVar3 & (uint)final_layer_local;
    local_78 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)i,(ulong)local_64);
    std::_Bit_reference::operator=(&local_78,false);
  }
  return false;
}

Assistant:

bool testSeed(const Bin<KeyType>& bin, size_t n2, std::vector<bool>& final_layer){
    for(size_t i = bin.keys.size()-1; i < std::numeric_limits<size_t>::max(); i--){
        const KeyType& key = bin.keys[i];
        const uint32_t h = hash2(key, bin.seed) & n2;
        if(final_layer[h]){
            for(size_t j = i + 1; j < bin.keys.size(); j++){
                const KeyType& key = bin.keys[j];
                const uint32_t h = hash2(key, bin.seed) & n2;
                final_layer[h] = false;
            }

            return false;
        }

        final_layer[h] = true;
    }

    return true;
}